

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

void __thiscall
TransitionObservationIndependentMADPDiscrete::GetObservationProbability
          (TransitionObservationIndependentMADPDiscrete *this)

{
  Index in_ECX;
  Index in_EDX;
  Index in_ESI;
  
  GetObservationProbability
            ((TransitionObservationIndependentMADPDiscrete *)
             (&(this->super_MultiAgentDecisionProcess).field_0x0 +
             *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x130)),in_ESI,in_EDX,
             in_ECX);
  return;
}

Assistant:

double TransitionObservationIndependentMADPDiscrete::
GetObservationProbability(Index jaI,
                          Index sucSI, 
                          Index joI) const
{
    double p=1;
    if(!_m_jointModelsGenerated)
    {
        vector<Index> sucSIs=JointToIndividualStateIndices(sucSI);
        vector<Index> aIs=JointToIndividualActionIndices(jaI);
        vector<Index> oIs=JointToIndividualObservationIndices(joI);
        for(Index agI = 0; agI < GetNrAgents(); agI++)
        {
            p*=GetIndividualMADPD(agI)->GetObservationProbability(
                aIs[agI],
                sucSIs[agI],
                oIs[agI]);
            if(p==0)
                break;
        }
    }
    else
    {
        for(Index agI = 0; agI < GetNrAgents(); agI++)
        {
            p*=GetIndividualMADPD(agI)->GetObservationProbability(
                _m_jointToIndActionCache[jaI][agI],
                _m_indivStateIndices[sucSI][agI],
                _m_jointToIndObsCache[joI][agI]);
            if(p==0)
                break;
        }
    }
    return(p);
}